

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<double>
          (OutOfRangeException *this,string *msg,double params)

{
  double in_RSI;
  string *in_RDI;
  OutOfRangeException *this_00;
  OutOfRangeException local_38 [2];
  
  this_00 = local_38;
  Exception::ConstructMessage<double>(in_RDI,in_RSI);
  OutOfRangeException(this_00,in_RDI);
  ::std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}